

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O1

char * fl_find_fontsize(char *name)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  char *c;
  
  if (*name != '-') {
    cVar4 = name[1];
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    pcVar2 = name + 1;
    pcVar1 = (char *)0x0;
    do {
      if (((int)cVar4 - 0x30U < 10) && (9 < (int)pcVar2[-1] - 0x30U)) {
        pcVar1 = pcVar2;
      }
      cVar4 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while (cVar4 != '\0');
    return pcVar1;
  }
  pcVar1 = name + 1;
  iVar3 = 7;
  do {
    if (pcVar1[-1] == '-') {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        if (9 < (int)*pcVar1 - 0x30U) {
          return (char *)0x0;
        }
        return pcVar1;
      }
    }
    else if (pcVar1[-1] == '\0') {
      return (char *)0x0;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

char* fl_find_fontsize(char* name) {
  char* c = name;
  // for standard x font names, try after 7th dash:
  if (*c == '-') {
    c = (char*)fl_font_word(c,7);
    if (*c++ && isdigit(*c)) return c;
    return 0; // malformed x font name?
  }
  char* r = 0;
  // find last set of digits:
  for (c++;* c; c++)
    if (isdigit(*c) && !isdigit(*(c-1))) r = c;
  return r;
}